

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>
          (anon_unknown_0 *this,ArrayPtr<const_capnp::word> data)

{
  anon_class_8_1_898a9ca8 *func;
  anon_class_8_1_898a9ca8 *func_00;
  anon_class_8_1_898a9ca8 *func_01;
  anon_unknown_0 **local_698;
  Maybe<kj::Exception> local_690;
  anon_unknown_0 **local_4f8;
  Maybe<kj::Exception> local_4f0;
  anon_unknown_0 **local_358;
  Maybe<kj::Exception> local_350;
  anon_unknown_0 **local_1b8;
  Maybe<kj::Exception> local_1b0;
  anon_unknown_0 *local_18;
  ArrayPtr<const_capnp::word> data_local;
  
  data_local.ptr = data.ptr;
  local_1b8 = &local_18;
  local_18 = this;
  kj::
  runCatchingExceptions<capnp::_::(anonymous_namespace)::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>(kj::ArrayPtr<capnp::word_const>)::_lambda()_1_>
            (&local_1b0,(kj *)&local_1b8,(anon_class_8_1_898a9ca8 *)data.size_);
  kj::Maybe<kj::Exception>::~Maybe(&local_1b0);
  local_358 = &local_18;
  kj::
  runCatchingExceptions<capnp::_::(anonymous_namespace)::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>(kj::ArrayPtr<capnp::word_const>)::_lambda()_2_>
            (&local_350,(kj *)&local_358,func);
  kj::Maybe<kj::Exception>::~Maybe(&local_350);
  local_4f8 = &local_18;
  kj::
  runCatchingExceptions<capnp::_::(anonymous_namespace)::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>(kj::ArrayPtr<capnp::word_const>)::_lambda()_3_>
            (&local_4f0,(kj *)&local_4f8,func_00);
  kj::Maybe<kj::Exception>::~Maybe(&local_4f0);
  local_698 = &local_18;
  kj::
  runCatchingExceptions<capnp::_::(anonymous_namespace)::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>(kj::ArrayPtr<capnp::word_const>)::_lambda()_4_>
            (&local_690,(kj *)&local_698,func_01);
  kj::Maybe<kj::Exception>::~Maybe(&local_690);
  return;
}

Assistant:

void traverseCatchingExceptions(kj::ArrayPtr<const word> data) {
  // Try traversing through Checker.
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(Checker::check(reader) != 0) { break; }
  });

  // Try traversing through AnyPointer.
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(traverse(reader.getRoot<AnyPointer>()) != 0) { break; }
  });

  // Try counting the size..
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(reader.getRoot<AnyPointer>().targetSize().wordCount != 0) { break; }
  });

  // Try copying into a builder, and if that works, traversing it with Checker.
  static word buffer[8192];
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    MallocMessageBuilder copyBuilder(buffer);
    copyBuilder.setRoot(reader.getRoot<AnyPointer>());
    KJ_ASSERT(Checker::check(copyBuilder) != 0) { break; }
  });
}